

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::checkfac4encroach
          (tetgenmesh *this,point pa,point pb,point pc,point checkpt,double *cent,double *r)

{
  int iVar1;
  double dVar2;
  undefined4 *puVar3;
  tetgenmesh *this_00;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double prjpt [3];
  double n [3];
  double local_b8;
  double dStack_b0;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  this_00 = this;
  circumsphere(this,pa,pb,pc,(double *)0x0,cent,&local_50);
  if ((local_50 == 0.0) && (!NAN(local_50))) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 2;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  dVar6 = SQRT((checkpt[2] - cent[2]) * (checkpt[2] - cent[2]) +
               (*checkpt - *cent) * (*checkpt - *cent) +
               (checkpt[1] - cent[1]) * (checkpt[1] - cent[1]));
  uVar4 = -(ulong)(ABS(dVar6 - local_50) / local_50 < this->b->epsilon);
  if (local_50 <= (double)(uVar4 & (ulong)local_50 | ~uVar4 & (ulong)dVar6)) {
    return 0;
  }
  if (this->b->metric == 0) {
    *r = local_50;
  }
  else {
    iVar1 = this->pointmtrindex;
    if (pa[iVar1] <= 0.0) {
      return 1;
    }
    if (pb[iVar1] <= 0.0) {
      return 1;
    }
    if (pc[iVar1] <= 0.0) {
      return 1;
    }
    projpt2face(this_00,checkpt,pa,pb,pc,&local_98);
    facenormal(this_00,pa,pb,pc,&local_48,1,(double *)0x0);
    dVar5 = SQRT(local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40);
    facenormal(this_00,pa,pb,&local_98,&local_48,1,(double *)0x0);
    dVar2 = local_38;
    local_68 = local_48;
    dStack_60 = dStack_40;
    local_78 = dStack_40;
    dStack_70 = local_38;
    facenormal(this_00,pb,pc,&local_98,&local_48,1,(double *)0x0);
    auVar7._0_8_ = local_68 * local_68 + local_78 * local_78;
    auVar7._8_8_ = local_48 * local_48 + dStack_40 * dStack_40;
    dVar6 = local_38 * local_38 + auVar7._8_8_;
    auVar8._8_4_ = SUB84(dVar6,0);
    auVar8._0_8_ = dVar2 * dVar2 + auVar7._0_8_;
    auVar8._12_4_ = (int)((ulong)dVar6 >> 0x20);
    auVar8 = sqrtpd(auVar7,auVar8);
    facenormal(this_00,pc,pa,&local_98,&local_48,1,(double *)0x0);
    local_b8 = auVar8._0_8_;
    dStack_b0 = auVar8._8_8_;
    dVar6 = SQRT(local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40);
    if ((this->b->epsilon <= ABS((local_b8 + dStack_b0 + dVar6) - dVar5) / dVar5) ||
       (iVar1 = this->pointmtrindex,
       (dVar6 / dVar5) * pb[iVar1] +
       (local_b8 / dVar5) * pc[iVar1] + (dStack_b0 / dVar5) * pa[iVar1] <=
       SQRT((checkpt[2] - local_88) * (checkpt[2] - local_88) +
            (*checkpt - local_98) * (*checkpt - local_98) +
            (checkpt[1] - local_90) * (checkpt[1] - local_90)))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int tetgenmesh::checkfac4encroach(point pa, point pb, point pc, point checkpt,
                                  REAL* cent, REAL* r)
{
  REAL rd, len;

  circumsphere(pa, pb, pc, NULL, cent, &rd);
  if (rd == 0) {
    terminatetetgen(this, 2);
  }
  len = distance(cent, checkpt);
  if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
 
  if (len < rd) {
    // The point lies inside the circumsphere of this face.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0) &&
          (pc[pointmtrindex] > 0)) {
        // Get the projection of 'checkpt' in the plane of pa, pb, and pc.
        REAL prjpt[3], n[3];
        REAL a, a1, a2, a3;
        projpt2face(checkpt, pa, pb, pc, prjpt);
        // Get the face area of [a,b,c].
        facenormal(pa, pb, pc, n, 1, NULL);
        a = sqrt(dot(n,n));
        // Get the face areas of [a,b,p], [b,c,p], and [c,a,p].
        facenormal(pa, pb, prjpt, n, 1, NULL);
        a1 = sqrt(dot(n,n));
        facenormal(pb, pc, prjpt, n, 1, NULL);
        a2 = sqrt(dot(n,n));
        facenormal(pc, pa, prjpt, n, 1, NULL);
        a3 = sqrt(dot(n,n));
        if ((fabs(a1 + a2 + a3 - a) / a) < b->epsilon) {
          // This face contains the projection.
          // Get the mesh size at the location of the projection point.
          rd = a1 / a * pc[pointmtrindex]
             + a2 / a * pa[pointmtrindex]
             + a3 / a * pb[pointmtrindex];
          len = distance(prjpt, checkpt);
          if (len < rd) {
            return 1; // Encroached.
          }
        }
      } else {
        return 1;  // No protecting ball. Encroached.
      }
    } else {
      *r = rd;
      return 1;  // Encroached.
    }
  }

  return 0;
}